

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newmem.c
# Opt level: O3

void * talloc_struct(long nStructSize)

{
  void *pvVar1;
  long lVar2;
  string_view fmt;
  
  if (talloc_struct::tStrPtr == (void *)0x0) {
    talloc_struct::tStrPtr = operator_new__(100000);
    talloc_struct::tStrBase = talloc_struct::tStrPtr;
  }
  if (nStructSize < 0x186a1) {
    lVar2 = talloc_struct::tStrMem;
    if (99999 < talloc_struct::tStrMem + nStructSize) {
      lVar2 = 0;
      wiznet("Temporary struct allocation space allotted, returning to origination.",
             (CHAR_DATA *)0x0,(OBJ_DATA *)0x0,0x16,0,0);
      talloc_struct::tStrPtr = talloc_struct::tStrBase;
    }
    talloc_struct::tStrMem = lVar2 + nStructSize;
    pvVar1 = talloc_struct::tStrPtr;
    talloc_struct::tStrPtr = (void *)((long)talloc_struct::tStrPtr + nStructSize);
  }
  else {
    fmt._M_str = "Error: Temp struct too large.";
    fmt._M_len = 0x1d;
    CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
    pvVar1 = (void *)0x0;
  }
  return pvVar1;
}

Assistant:

void *talloc_struct(long nStructSize)
{
	static long tStrMem = 0;
	static void *tStrPtr = nullptr, *tStrBase;
	char *tStrNew; 
 
	if(!tStrPtr) {
		tStrPtr = init_temp_struct_mem();
		tStrBase = tStrPtr;
	}
	if(!tStrPtr)
		return nullptr;
	if(nStructSize > TEMP_STRUCT_MEM_SIZE)
	{
		RS.Logger.Warn("Error: Temp struct too large.");
		return nullptr;
	}
	if(tStrMem + nStructSize >= TEMP_STRUCT_MEM_SIZE)
	{       //current loc + new struct is over limit, go back around the mulberry bush
		wiznet("Temporary struct allocation space allotted, returning to origination.",nullptr,nullptr,WIZ_LOG,0,0);
		tStrPtr = tStrBase;
		tStrMem = 0;
	}
	tStrNew = (char *)tStrPtr;
	tStrPtr = (void *)((char *)tStrPtr + nStructSize);
	tStrMem = tStrMem + nStructSize;
	return tStrNew;
}